

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

string * __thiscall
proto2_unittest::TestAllTypes::release_optional_string_abi_cxx11_(TestAllTypes *this)

{
  uint uVar1;
  string *psVar2;
  
  uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((uVar1 & 1) == 0) {
    return (string *)0x0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = uVar1 & 0xfffffffe;
  psVar2 = google::protobuf::internal::ArenaStringPtr::Release_abi_cxx11_
                     (&(this->field_0)._impl_.optional_string_);
  return psVar2;
}

Assistant:

TestAllTypes::release_optional_string() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  // @@protoc_insertion_point(field_release:proto2_unittest.TestAllTypes.optional_string)
  if ((_impl_._has_bits_[0] & 0x00000001u) == 0) {
    return nullptr;
  }
  _impl_._has_bits_[0] &= ~0x00000001u;
  auto* released = _impl_.optional_string_.Release();
  if (::google::protobuf::internal::DebugHardenForceCopyDefaultString()) {
    _impl_.optional_string_.Set("", GetArena());
  }
  return released;
}